

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

DataType __thiscall adios2::VariableNT::StructFieldType(VariableNT *this,size_t index)

{
  DataType DVar1;
  VariableBase *pVVar2;
  ulong uVar3;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar2 = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to VariableNT::StructFieldType",(allocator *)&local_f8);
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pVVar2 = this->m_Variable;
  if (*(int *)(pVVar2 + 0x28) != 0x10) {
    std::__cxx11::string::string((string *)&local_f8,"bindings::CXX11",&local_f9);
    std::__cxx11::string::string((string *)&local_58,"VariableNT",&local_fa);
    std::__cxx11::string::string((string *)&local_78,"StructFieldType",&local_fb);
    adios2::ToString_abi_cxx11_((DataType)&local_d8);
    std::operator+(&local_b8,"invalid data type ",&local_d8);
    std::operator+(&local_98,&local_b8,", only Struct type supports this API");
    helper::Throw<std::runtime_error>(&local_f8,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_f8);
    pVVar2 = this->m_Variable;
  }
  uVar3 = *(ulong *)(pVVar2 + 0x248);
  if (uVar3 == 0) {
    uVar3 = *(ulong *)(pVVar2 + 0x240);
  }
  DVar1 = adios2::core::StructDefinition::Type(uVar3);
  return DVar1;
}

Assistant:

DataType VariableNT::StructFieldType(const size_t index) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldType");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFieldType",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Type(index);
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Type(index);
}